

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocusTanFixedRadiusArc.cpp
# Opt level: O0

int GeoCalcs::LocusTanFixedRadiusArc
              (Locus *loc1,Locus *loc2,double radius,int *dir,LLPoint *center,LLPoint *intersection1
              ,LLPoint *intersection2,double dTol,double dEps)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  LLPoint LVar7;
  double lcrs1;
  LLPoint geoPt;
  int local_10c;
  double dStack_108;
  int k;
  double dErr;
  double dStack_f8;
  int maxCount;
  double errarray [2];
  double distarray [2];
  double local_d0;
  double distbase;
  LLPoint geoPt1;
  double dDistFromPt;
  double dCrsFromPt;
  double locAngle;
  double geoCrs1;
  double vertexAngle;
  double angle;
  double rcrs1;
  double crs32;
  double crs12;
  InverseResult result;
  double dEps_local;
  double dTol_local;
  LLPoint *intersection2_local;
  LLPoint *intersection1_local;
  LLPoint *center_local;
  int *dir_local;
  double radius_local;
  Locus *loc2_local;
  Locus *loc1_local;
  
  result.distance = dEps;
  INVERSE_RESULT::INVERSE_RESULT((INVERSE_RESULT *)&crs12);
  DistVincenty(&loc1->locusStart,&loc1->locusEnd,(InverseResult *)&crs12);
  crs32 = crs12;
  DistVincenty(&loc2->locusEnd,&loc2->locusStart,(InverseResult *)&crs12);
  rcrs1 = crs12 + 3.141592653589793;
  iVar2 = TangentFixedRadiusArc
                    (&loc1->locusStart,crs32,&loc2->locusEnd,rcrs1,radius,dir,center,intersection1,
                     intersection2,dTol);
  if (iVar2 == 0) {
    loc1_local._4_4_ = 0;
  }
  else {
    DistVincenty(center,intersection1,(InverseResult *)&crs12);
    angle = crs12;
    DistVincenty(center,intersection2,(InverseResult *)&crs12);
    dVar4 = SignAzimuthDifference(angle,crs12);
    vertexAngle = ABS(dVar4);
    dVar4 = sin(vertexAngle / 2.0);
    dVar5 = cos(radius / kSphereRadius);
    dVar4 = acos(dVar4 * dVar5);
    geoCrs1 = dVar4 * 2.0;
    DistVincenty(&loc1->geoStart,&loc1->geoEnd,(InverseResult *)&crs12);
    locAngle = crs12;
    dCrsFromPt = atan((loc1->endDist - loc1->startDist) / result.reverseAzimuth);
    LVar7 = PerpIntercept(&loc1->geoStart,locAngle,intersection1,&dDistFromPt,&geoPt1.longitude,dTol
                         );
    distbase = LVar7.latitude;
    geoPt1.latitude = LVar7.longitude;
    DistVincenty(&loc1->geoStart,(LLPoint *)&distbase,(InverseResult *)&crs12);
    local_d0 = result.reverseAzimuth;
    errarray[0] = 0.0;
    dStack_f8 = 0.0;
    distarray[0] = 0.0;
    errarray[1] = 0.0;
    dStack_108 = 0.0;
    local_10c = 0;
    while( true ) {
      bVar1 = true;
      if (local_10c != 0) {
        uVar3 = std::isnan(local_d0);
        bVar1 = false;
        if (((uVar3 & 1) == 0) && (bVar1 = false, local_10c < 0xf)) {
          bVar1 = dTol < ABS(dStack_108);
        }
      }
      if (!bVar1) break;
      if (0 < local_10c) {
        LVar7 = DestVincenty(&loc1->geoStart,locAngle,local_d0);
        distbase = LVar7.latitude;
        geoPt1.latitude = LVar7.longitude;
      }
      LVar7 = PointOnLocusP(loc1,(LLPoint *)&distbase,dTol,result.distance);
      geoPt.longitude = LVar7.latitude;
      intersection1->latitude = geoPt.longitude;
      intersection1->longitude = LVar7.longitude;
      LLPOINT::LLPOINT((LLPOINT *)&lcrs1);
      dVar4 = LocusCrsAtPoint(loc1,intersection1,(LLPoint *)&lcrs1,1e-08);
      LVar7 = DestVincenty(intersection1,-(double)*dir * 1.5707963267948966 + dVar4,radius);
      center->latitude = LVar7.latitude;
      center->longitude = LVar7.longitude;
      iVar2 = LocusPerpIntercept(loc2,center,&dDistFromPt,&geoPt1.longitude,intersection2,dTol);
      if (iVar2 == 0) {
        LLPOINT::Set(intersection2,-INFINITY,-INFINITY);
      }
      DistVincenty(center,intersection2,(InverseResult *)&crs12);
      dVar4 = local_d0;
      dStack_108 = result.reverseAzimuth - radius;
      errarray[1] = distarray[0];
      distarray[0] = local_d0;
      dStack_f8 = errarray[0];
      errarray[0] = dStack_108;
      if (local_10c == 0) {
        dVar5 = cos(dCrsFromPt);
        dVar6 = sin(geoCrs1);
        local_d0 = dStack_108 * (dVar5 / dVar6) + dVar4;
      }
      else {
        FindLinearRoot(errarray + 1,&stack0xffffffffffffff08,&local_d0);
      }
      local_10c = local_10c + 1;
    }
    loc1_local._4_4_ = 1;
  }
  return loc1_local._4_4_;
}

Assistant:

int LocusTanFixedRadiusArc(const Locus &loc1, const Locus &loc2, double radius,
                               int &dir, LLPoint &center, LLPoint &intersection1, LLPoint &intersection2,
                               double dTol, double dEps)
    {
        InverseResult result;
        DistVincenty(loc1.locusStart, loc1.locusEnd, result);
        const double crs12 = result.azimuth;

        DistVincenty(loc2.locusEnd, loc2.locusStart, result);
        const double crs32 = result.azimuth + M_PI;

        if (TangentFixedRadiusArc(loc1.locusStart, crs12, loc2.locusEnd, crs32,
                                  radius, dir, center, intersection1, intersection2, dTol) == 0)
            return 0;

        DistVincenty(center, intersection1, result);
        const double rcrs1 = result.azimuth;

        DistVincenty(center, intersection2, result);
        const double angle = fabs(SignAzimuthDifference(rcrs1, result.azimuth));
        const double vertexAngle = 2 * acos(sin(angle / 2.0) * cos(radius / kSphereRadius));

        DistVincenty(loc1.geoStart, loc1.geoEnd, result);
        const double geoCrs1 = result.azimuth;
        const double locAngle = atan((loc1.endDist - loc1.startDist) / result.distance);

        double dCrsFromPt, dDistFromPt;
        LLPoint geoPt1 = PerpIntercept(loc1.geoStart, geoCrs1, intersection1, dCrsFromPt, dDistFromPt, dTol);
        DistVincenty(loc1.geoStart, geoPt1, result);
        double distbase = result.distance;

        double distarray[2], errarray[2];
        distarray[0] = distarray[1] = errarray[0] = errarray[1] = 0.0;

        const int maxCount = 15;
        double dErr = 0.0;
        int k = 0;
        while (k == 0 || (!std::isnan(distbase) && k < maxCount && fabs(dErr) > dTol))
        {
            if (k > 0)
            {
                geoPt1 = DestVincenty(loc1.geoStart, geoCrs1, distbase);
            }

            intersection1 = PointOnLocusP(loc1, geoPt1, dTol, dEps);
            LLPoint geoPt;
            const double lcrs1 = LocusCrsAtPoint(loc1, intersection1, geoPt, 1e-8) - dir * M_PI_2;
            center = DestVincenty(intersection1, lcrs1, radius);

            if (!LocusPerpIntercept(loc2, center, dCrsFromPt, dDistFromPt, intersection2, dTol))
            {
                intersection2.Set(-HUGE_VAL, -HUGE_VAL);
            }

            DistVincenty(center, intersection2, result);
            dErr = result.distance - radius;
            distarray[0] = distarray[1];
            distarray[1] = distbase;
            errarray[0] = errarray[1];
            errarray[1] = dErr;

            if (k == 0)
                distbase = distbase + dErr * (cos(locAngle) / sin(vertexAngle));
            else
                FindLinearRoot(distarray, errarray, distbase);
            k++;
        }
        return 1;
    }